

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

RGB __thiscall pbrt::RGBFilm::GetPixelRGB(RGBFilm *this,Point2i *p,Float splatScale)

{
  Float *pFVar1;
  AtomicDouble *pAVar2;
  Pixel *pPVar3;
  undefined1 auVar4 [16];
  int c;
  long lVar5;
  float *pfVar6;
  SquareMatrix<3> *pSVar7;
  int iVar8;
  int j;
  Float *pFVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  RGB RVar13;
  float local_2c;
  undefined8 local_28;
  Float local_1c;
  undefined8 local_18;
  
  iVar8 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  pPVar3 = (this->pixels).values;
  iVar8 = ((this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar8) *
          ((p->super_Tuple2<pbrt::Point2,_int>).y -
          (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
          ((p->super_Tuple2<pbrt::Point2,_int>).x - iVar8);
  auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])pPVar3[iVar8].rgbSum);
  local_28 = vmovlps_avx(auVar4);
  local_2c = (float)pPVar3[iVar8].rgbSum[2];
  fVar11 = (float)pPVar3[iVar8].weightSum;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    auVar12._4_4_ = fVar11;
    auVar12._0_4_ = fVar11;
    auVar12._8_4_ = fVar11;
    auVar12._12_4_ = fVar11;
    auVar4 = vdivps_avx(auVar4,auVar12);
    local_2c = (float)pPVar3[iVar8].rgbSum[2] / fVar11;
    local_28 = vmovlps_avx(auVar4);
  }
  lVar5 = 0;
  do {
    pAVar2 = pPVar3[iVar8].splatRGB + lVar5;
    pfVar6 = (float *)&local_28;
    if (((int)lVar5 != 0) && (pfVar6 = (float *)((long)&local_28 + 4), (int)lVar5 != 1)) {
      pfVar6 = &local_2c;
    }
    lVar5 = lVar5 + 1;
    *pfVar6 = (float)(((double)splatScale *
                      (double)(pAVar2->bits).super___atomic_base<unsigned_long>._M_i) /
                      (double)this->filterIntegral + (double)*pfVar6);
  } while (lVar5 != 3);
  pSVar7 = &this->outputRGBFromSensorRGB;
  lVar5 = 0;
  local_18 = 0;
  local_1c = 0.0;
  do {
    iVar8 = (int)lVar5;
    pFVar9 = (Float *)&local_18;
    if ((iVar8 != 0) && (pFVar9 = (Float *)((long)&local_18 + 4), iVar8 != 1)) {
      pFVar9 = &local_1c;
    }
    *pFVar9 = 0.0;
    lVar10 = 0;
    do {
      pfVar6 = (float *)&local_28;
      if (((int)lVar10 != 0) && (pfVar6 = (float *)((long)&local_28 + 4), (int)lVar10 != 1)) {
        pfVar6 = &local_2c;
      }
      pFVar9 = (Float *)&local_18;
      if ((iVar8 != 0) && (pFVar9 = (Float *)((long)&local_18 + 4), iVar8 != 1)) {
        pFVar9 = &local_1c;
      }
      pFVar1 = pSVar7->m[0] + lVar10;
      lVar10 = lVar10 + 1;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)*pfVar6),ZEXT416((uint)*pFVar1),ZEXT416((uint)*pFVar9))
      ;
      *pFVar9 = auVar4._0_4_;
    } while (lVar10 != 3);
    lVar5 = lVar5 + 1;
    pSVar7 = (SquareMatrix<3> *)(pSVar7->m + 1);
  } while (lVar5 != 3);
  RVar13.b = local_1c;
  RVar13.r = (Float)(undefined4)local_18;
  RVar13.g = (Float)local_18._4_4_;
  return RVar13;
}

Assistant:

PBRT_CPU_GPU
    RGB GetPixelRGB(const Point2i &p, Float splatScale = 1) const {
        const Pixel &pixel = pixels[p];
        RGB rgb(pixel.rgbSum[0], pixel.rgbSum[1], pixel.rgbSum[2]);
        // Normalize _rgb_ with weight sum
        Float weightSum = pixel.weightSum;
        if (weightSum != 0)
            rgb /= weightSum;

        // Add splat value at pixel
        for (int c = 0; c < 3; ++c)
            rgb[c] += splatScale * pixel.splatRGB[c] / filterIntegral;

        // Convert _rgb_ to output RGB color space
        rgb = outputRGBFromSensorRGB * rgb;

        return rgb;
    }